

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

void Cec_ManSatAddToStore(Vec_Int_t *vCexStore,Vec_Int_t *vCex,int Out)

{
  int iVar1;
  undefined4 local_20;
  int Entry;
  int i;
  int Out_local;
  Vec_Int_t *vCex_local;
  Vec_Int_t *vCexStore_local;
  
  Vec_IntPush(vCexStore,Out);
  if (vCex == (Vec_Int_t *)0x0) {
    Vec_IntPush(vCexStore,-1);
  }
  else {
    iVar1 = Vec_IntSize(vCex);
    Vec_IntPush(vCexStore,iVar1);
    for (local_20 = 0; iVar1 = Vec_IntSize(vCex), local_20 < iVar1; local_20 = local_20 + 1) {
      iVar1 = Vec_IntEntry(vCex,local_20);
      Vec_IntPush(vCexStore,iVar1);
    }
  }
  return;
}

Assistant:

void Cec_ManSatAddToStore( Vec_Int_t * vCexStore, Vec_Int_t * vCex, int Out )
{
    int i, Entry;
    Vec_IntPush( vCexStore, Out );
    if ( vCex == NULL ) // timeout
    {
        Vec_IntPush( vCexStore, -1 );
        return;
    }
    // write the counter-example
    Vec_IntPush( vCexStore, Vec_IntSize(vCex) );
    Vec_IntForEachEntry( vCex, Entry, i )
        Vec_IntPush( vCexStore, Entry );
}